

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joint.cc
# Opt level: O0

void RigidBodyDynamics::jcalc_X_lambda_S(Model *model,uint joint_id,VectorNd *q)

{
  reference pvVar1;
  SpatialVector_t *pSVar2;
  Scalar *pSVar3;
  CoeffReturnType pdVar4;
  Scalar SVar5;
  reference ppCVar6;
  RBDLError *this;
  SpatialTransform *in_RDX;
  uint in_ESI;
  long in_RDI;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  CustomJoint *custom_joint;
  SpatialVector_t *joint;
  Scalar q2_3;
  Scalar q1_3;
  Scalar q0_3;
  Scalar c2_2;
  Scalar s2_2;
  Scalar c1_2;
  Scalar s1_2;
  Scalar c0_2;
  Scalar s0_2;
  Scalar q2_2;
  Scalar q1_2;
  Scalar q0_2;
  Scalar c2_1;
  Scalar s2_1;
  Scalar c1_1;
  Scalar s1_1;
  Scalar c0_1;
  Scalar s0_1;
  Scalar q2_1;
  Scalar q1_1;
  Scalar q0_1;
  Scalar c2;
  Scalar s2;
  Scalar c1;
  Scalar s1;
  Scalar c0;
  Scalar s0;
  Scalar q2;
  Scalar q1;
  Scalar q0;
  Vector3d trans;
  SpatialTransform XJ;
  SpatialTransform *in_stack_fffffffffffff1b8;
  SpatialTransform *pSVar13;
  SpatialTransform *in_stack_fffffffffffff1c0;
  SpatialTransform *pSVar14;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3,_1,_false>_>
  *in_stack_fffffffffffff1c8;
  Matrix3d *pMVar15;
  SpatialTransform *in_stack_fffffffffffff1d0;
  SpatialTransform *pSVar16;
  string *in_stack_fffffffffffff1d8;
  allocator<char> *in_stack_fffffffffffff1f0;
  VectorNd *in_stack_fffffffffffff1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff200;
  Model *in_stack_fffffffffffff208;
  SpatialTransform *pSVar17;
  Vector3_t *in_stack_fffffffffffff210;
  double *in_stack_fffffffffffff218;
  double *in_stack_fffffffffffff220;
  double *in_stack_fffffffffffff228;
  double *in_stack_fffffffffffff230;
  double *in_stack_fffffffffffff238;
  SpatialVector_t *in_stack_fffffffffffff240;
  double *in_stack_fffffffffffff248;
  Matrix3_t *in_stack_fffffffffffff250;
  double *in_stack_fffffffffffff260;
  double *in_stack_fffffffffffff268;
  double *in_stack_fffffffffffff270;
  double *in_stack_fffffffffffff278;
  SpatialTransform *in_stack_fffffffffffff280;
  SpatialTransform *in_stack_fffffffffffff288;
  Scalar *in_stack_fffffffffffff2a0;
  undefined1 local_b18 [24];
  SpatialTransform local_b00;
  VectorNd *in_stack_fffffffffffff588;
  uint in_stack_fffffffffffff594;
  Model *in_stack_fffffffffffff598;
  undefined1 local_950 [24];
  double local_938;
  double local_930;
  double local_928;
  double local_920;
  double local_918;
  double local_808;
  double local_800;
  double local_7f8;
  SpatialTransform local_7f0;
  undefined1 local_790 [24];
  SpatialTransform local_778 [3];
  Scalar local_640;
  double local_638;
  double local_630;
  double local_628;
  double local_620;
  double local_618;
  double local_610;
  double local_608;
  double local_600;
  undefined8 local_5f8;
  undefined8 local_5f0;
  undefined8 local_5e8;
  SpatialTransform *local_20;
  uint local_14;
  long local_10;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  pvVar1 = std::
           vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
           operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                       *)(in_RDI + 0xa0),(ulong)in_ESI);
  if (pvVar1->mJointType == JointTypeRevoluteX) {
    std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
    operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                *)(local_10 + 0xa0),(ulong)local_14);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
               in_stack_fffffffffffff1c0,(Index)in_stack_fffffffffffff1b8);
    Math::Xrotx(in_stack_fffffffffffff2a0);
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                  *)(local_10 + 0x130),(ulong)local_14);
    Math::SpatialTransform::operator*(in_stack_fffffffffffff288,in_stack_fffffffffffff280);
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                  *)(local_10 + 0x2e8),(ulong)local_14);
    Math::SpatialTransform::operator=(in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8);
    std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
    operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                *)(local_10 + 0xa0),(ulong)local_14);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               (local_10 + 0xb8),(ulong)local_14);
    SpatialVector_t::operator=
              ((SpatialVector_t *)in_stack_fffffffffffff1c0,
               (SpatialVector_t *)in_stack_fffffffffffff1b8);
  }
  else {
    pvVar1 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)(local_10 + 0xa0),(ulong)local_14);
    if (pvVar1->mJointType == JointTypeRevoluteY) {
      std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
      operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)(local_10 + 0xa0),(ulong)local_14);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                 in_stack_fffffffffffff1c0,(Index)in_stack_fffffffffffff1b8);
      Math::Xroty(in_stack_fffffffffffff2a0);
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                    *)(local_10 + 0x130),(ulong)local_14);
      Math::SpatialTransform::operator*(in_stack_fffffffffffff288,in_stack_fffffffffffff280);
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                    *)(local_10 + 0x2e8),(ulong)local_14);
      Math::SpatialTransform::operator=(in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8);
      std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
      operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)(local_10 + 0xa0),(ulong)local_14);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 (local_10 + 0xb8),(ulong)local_14);
      SpatialVector_t::operator=
                ((SpatialVector_t *)in_stack_fffffffffffff1c0,
                 (SpatialVector_t *)in_stack_fffffffffffff1b8);
    }
    else {
      pvVar1 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)(local_10 + 0xa0),(ulong)local_14);
      if (pvVar1->mJointType == JointTypeRevoluteZ) {
        std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
        operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    *)(local_10 + 0xa0),(ulong)local_14);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                  ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                   in_stack_fffffffffffff1c0,(Index)in_stack_fffffffffffff1b8);
        Math::Xrotz(in_stack_fffffffffffff2a0);
        std::
        vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                      *)(local_10 + 0x130),(ulong)local_14);
        Math::SpatialTransform::operator*(in_stack_fffffffffffff288,in_stack_fffffffffffff280);
        std::
        vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                      *)(local_10 + 0x2e8),(ulong)local_14);
        Math::SpatialTransform::operator=(in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8);
        std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
        operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    *)(local_10 + 0xa0),(ulong)local_14);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   (local_10 + 0xb8),(ulong)local_14);
        SpatialVector_t::operator=
                  ((SpatialVector_t *)in_stack_fffffffffffff1c0,
                   (SpatialVector_t *)in_stack_fffffffffffff1b8);
      }
      else {
        pvVar1 = std::
                 vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               *)(local_10 + 0xa0),(ulong)local_14);
        if (pvVar1->mJointType == JointTypeHelical) {
          jcalc_XJ(in_stack_fffffffffffff598,in_stack_fffffffffffff594,in_stack_fffffffffffff588);
          std::
          vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
          ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                        *)(local_10 + 0x130),(ulong)local_14);
          Math::SpatialTransform::operator*(in_stack_fffffffffffff288,in_stack_fffffffffffff280);
          std::
          vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
          ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                        *)(local_10 + 0x2e8),(ulong)local_14);
          Math::SpatialTransform::operator=(in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8);
          std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                        *)(local_10 + 0xa0),(ulong)local_14);
          Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::block<3,1>
                    ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff1d0,
                     (Index)in_stack_fffffffffffff1c8,(Index)in_stack_fffffffffffff1c0);
          Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                    ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff1d0,
                     in_stack_fffffffffffff1c8);
          Vector3_t::
          Vector3_t<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,3,1,false>,0>>
                    ((Vector3_t *)in_stack_fffffffffffff1c0,
                     (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3,_1,_false>,_0>_>
                      *)in_stack_fffffffffffff1b8);
          std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                        *)(local_10 + 0xa0),(ulong)local_14);
          Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                    ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                     in_stack_fffffffffffff1c0,(Index)in_stack_fffffffffffff1b8);
          std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                        *)(local_10 + 0xa0),(ulong)local_14);
          Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                    ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                     in_stack_fffffffffffff1c0,(Index)in_stack_fffffffffffff1b8);
          std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                        *)(local_10 + 0xa0),(ulong)local_14);
          Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                    ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                     in_stack_fffffffffffff1c0,(Index)in_stack_fffffffffffff1b8);
          Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                    ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                     in_stack_fffffffffffff1c0,(Index)in_stack_fffffffffffff1b8);
          Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                    ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                     in_stack_fffffffffffff1c0,(Index)in_stack_fffffffffffff1b8);
          pSVar2 = (SpatialVector_t *)
                   Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                              in_stack_fffffffffffff1c0,(Index)in_stack_fffffffffffff1b8);
          SpatialVector_t::SpatialVector_t
                    (in_stack_fffffffffffff240,in_stack_fffffffffffff238,in_stack_fffffffffffff230,
                     in_stack_fffffffffffff228,in_stack_fffffffffffff220,in_stack_fffffffffffff218,
                     (double *)in_stack_fffffffffffff250);
          std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                    ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                     (local_10 + 0xb8),(ulong)local_14);
          SpatialVector_t::operator=((SpatialVector_t *)in_stack_fffffffffffff1c0,pSVar2);
        }
        else {
          pvVar1 = std::
                   vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                   ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                 *)(local_10 + 0xa0),(ulong)local_14);
          if ((pvVar1->mDoFCount == 1) &&
             (pvVar1 = std::
                       vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                       ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                     *)(local_10 + 0xa0),(ulong)local_14),
             pvVar1->mJointType != JointTypeCustom)) {
            jcalc_XJ(in_stack_fffffffffffff598,in_stack_fffffffffffff594,in_stack_fffffffffffff588);
            std::
            vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
            ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                          *)(local_10 + 0x130),(ulong)local_14);
            Math::SpatialTransform::operator*(in_stack_fffffffffffff288,in_stack_fffffffffffff280);
            std::
            vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
            ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                          *)(local_10 + 0x2e8),(ulong)local_14);
            Math::SpatialTransform::operator=(in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8);
            std::
            vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
            operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                        *)(local_10 + 0xa0),(ulong)local_14);
            std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                      ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                       (local_10 + 0xb8),(ulong)local_14);
            SpatialVector_t::operator=
                      ((SpatialVector_t *)in_stack_fffffffffffff1c0,
                       (SpatialVector_t *)in_stack_fffffffffffff1b8);
          }
          else {
            pvVar1 = std::
                     vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                     ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                   *)(local_10 + 0xa0),(ulong)local_14);
            if (pvVar1->mJointType == JointTypeSpherical) {
              Model::GetQuaternion
                        (in_stack_fffffffffffff208,(uint)((ulong)in_stack_fffffffffffff200 >> 0x20),
                         in_stack_fffffffffffff1f8);
              Math::Quaternion::toMatrix((Quaternion *)in_stack_fffffffffffff250);
              local_5e8 = 0;
              local_5f0 = 0;
              local_5f8 = 0;
              Vector3_t::Vector3_t
                        (in_stack_fffffffffffff210,(double *)in_stack_fffffffffffff208,
                         (double *)in_stack_fffffffffffff200,(double *)in_stack_fffffffffffff1f8);
              Math::SpatialTransform::SpatialTransform
                        (in_stack_fffffffffffff1d0,(Matrix3d *)in_stack_fffffffffffff1c8,
                         (Vector3d *)in_stack_fffffffffffff1c0);
              std::
              vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
              ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                            *)(local_10 + 0x130),(ulong)local_14);
              Math::SpatialTransform::operator*(in_stack_fffffffffffff288,in_stack_fffffffffffff280)
              ;
              std::
              vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
              ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                            *)(local_10 + 0x2e8),(ulong)local_14);
              Math::SpatialTransform::operator=(in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8)
              ;
              std::
              vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                            *)(local_10 + 0x160),(ulong)local_14);
              Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::setZero
                        ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                         in_stack_fffffffffffff1c0);
              std::
              vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                            *)(local_10 + 0x160),(ulong)local_14);
              pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::operator()
                                 ((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                  in_stack_fffffffffffff1c0,(Index)in_stack_fffffffffffff1b8,
                                  0x83bf66);
              *pSVar3 = 1.0;
              std::
              vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                            *)(local_10 + 0x160),(ulong)local_14);
              pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::operator()
                                 ((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                  in_stack_fffffffffffff1c0,(Index)in_stack_fffffffffffff1b8,
                                  0x83bf9f);
              *pSVar3 = 1.0;
              std::
              vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                            *)(local_10 + 0x160),(ulong)local_14);
              pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::operator()
                                 ((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                  in_stack_fffffffffffff1c0,(Index)in_stack_fffffffffffff1b8,
                                  0x83bfd8);
              *pSVar3 = 1.0;
            }
            else {
              pvVar1 = std::
                       vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                       ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                     *)(local_10 + 0xa0),(ulong)local_14);
              if (pvVar1->mJointType == JointTypeEulerZYX) {
                std::
                vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                              *)(local_10 + 0xa0),(ulong)local_14);
                pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                         operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                    in_stack_fffffffffffff1c0,(Index)in_stack_fffffffffffff1b8);
                local_600 = *pdVar4;
                std::
                vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                              *)(local_10 + 0xa0),(ulong)local_14);
                pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                         operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                    in_stack_fffffffffffff1c0,(Index)in_stack_fffffffffffff1b8);
                local_608 = *pdVar4;
                std::
                vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                              *)(local_10 + 0xa0),(ulong)local_14);
                pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                         operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                    in_stack_fffffffffffff1c0,(Index)in_stack_fffffffffffff1b8);
                local_610 = *pdVar4;
                local_618 = sin(local_600);
                local_620 = cos(local_600);
                local_628 = sin(local_608);
                local_630 = cos(local_608);
                local_638 = sin(local_610);
                local_640 = cos(local_610);
                local_778[0].E.super_Matrix3d.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                [5] = local_620 * local_630;
                local_778[0].E.super_Matrix3d.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                [4] = local_618 * local_630;
                local_778[0].E.super_Matrix3d.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                [3] = -local_628;
                local_778[0].E.super_Matrix3d.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                [2] = local_620 * local_628 * local_638 + -(local_618 * local_640);
                local_778[0].E.super_Matrix3d.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                [1] = local_618 * local_628 * local_638 + local_620 * local_640;
                local_778[0].E.super_Matrix3d.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                [0] = local_630 * local_638;
                local_790._16_8_ = local_620 * local_628 * local_640 + local_618 * local_638;
                local_790._8_8_ = local_618 * local_628 * local_640 + -(local_620 * local_638);
                local_790._0_8_ = local_630 * local_640;
                pSVar13 = local_778;
                pSVar14 = (SpatialTransform *)(local_790 + 0x10);
                pMVar15 = (Matrix3d *)(local_790 + 8);
                pSVar16 = (SpatialTransform *)local_790;
                Matrix3_t::Matrix3_t
                          (in_stack_fffffffffffff250,in_stack_fffffffffffff248,
                           (double *)in_stack_fffffffffffff240,in_stack_fffffffffffff238,
                           in_stack_fffffffffffff230,in_stack_fffffffffffff228,
                           in_stack_fffffffffffff260,in_stack_fffffffffffff268,
                           in_stack_fffffffffffff270,in_stack_fffffffffffff278);
                local_7f0.E.super_Matrix3d.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                [8] = 0.0;
                local_7f0.E.super_Matrix3d.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                [7] = 0.0;
                local_7f0.E.super_Matrix3d.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                [6] = 0.0;
                Vector3_t::Vector3_t
                          (in_stack_fffffffffffff210,(double *)in_stack_fffffffffffff208,
                           (double *)in_stack_fffffffffffff200,(double *)in_stack_fffffffffffff1f8);
                Math::SpatialTransform::SpatialTransform(pSVar16,pMVar15,(Vector3d *)pSVar14);
                std::
                vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                              *)(local_10 + 0x130),(ulong)local_14);
                Math::SpatialTransform::operator*(local_20,in_stack_fffffffffffff280);
                std::
                vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                              *)(local_10 + 0x2e8),(ulong)local_14);
                Math::SpatialTransform::operator=(pSVar14,pSVar13);
                std::
                vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                              *)(local_10 + 0x160),(ulong)local_14);
                Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::setZero
                          ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)pSVar14);
                SVar5 = -local_628;
                std::
                vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                              *)(local_10 + 0x160),(ulong)local_14);
                pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::operator()
                                   ((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                    pSVar14,(Index)pSVar13,0x83c4ed);
                *pSVar3 = SVar5;
                std::
                vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                              *)(local_10 + 0x160),(ulong)local_14);
                pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::operator()
                                   ((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                    pSVar14,(Index)pSVar13,0x83c528);
                *pSVar3 = 1.0;
                dVar7 = local_630 * local_638;
                std::
                vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                              *)(local_10 + 0x160),(ulong)local_14);
                pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::operator()
                                   ((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                    pSVar14,(Index)pSVar13,0x83c57d);
                SVar5 = local_640;
                *pSVar3 = dVar7;
                std::
                vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                              *)(local_10 + 0x160),(ulong)local_14);
                pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::operator()
                                   ((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                    pSVar14,(Index)pSVar13,0x83c5c9);
                *pSVar3 = SVar5;
                dVar7 = local_630 * local_640;
                std::
                vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                              *)(local_10 + 0x160),(ulong)local_14);
                pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::operator()
                                   ((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                    pSVar14,(Index)pSVar13,0x83c61f);
                *pSVar3 = dVar7;
                SVar5 = -local_638;
                std::
                vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                              *)(local_10 + 0x160),(ulong)local_14);
                pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::operator()
                                   ((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                    pSVar14,(Index)pSVar13,0x83c684);
                *pSVar3 = SVar5;
              }
              else {
                pvVar1 = std::
                         vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                       *)(local_10 + 0xa0),(ulong)local_14);
                if (pvVar1->mJointType == JointTypeEulerXYZ) {
                  pSVar17 = local_20;
                  std::
                  vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                *)(local_10 + 0xa0),(ulong)local_14);
                  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                           operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                      in_stack_fffffffffffff1c0,(Index)in_stack_fffffffffffff1b8);
                  local_7f0.E.super_Matrix3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[5] = *pdVar4;
                  std::
                  vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                *)(local_10 + 0xa0),(ulong)local_14);
                  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                           operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                      in_stack_fffffffffffff1c0,(Index)in_stack_fffffffffffff1b8);
                  local_7f0.E.super_Matrix3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[4] = *pdVar4;
                  std::
                  vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                *)(local_10 + 0xa0),(ulong)local_14);
                  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                           operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                      in_stack_fffffffffffff1c0,(Index)in_stack_fffffffffffff1b8);
                  local_7f0.E.super_Matrix3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[3] = *pdVar4;
                  local_7f0.E.super_Matrix3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[2] = sin(local_7f0.E.super_Matrix3d.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[5]);
                  local_7f0.E.super_Matrix3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[1] = cos(local_7f0.E.super_Matrix3d.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[5]);
                  local_7f0.E.super_Matrix3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[0] = sin(local_7f0.E.super_Matrix3d.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[4]);
                  local_7f8 = cos(local_7f0.E.super_Matrix3d.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                  m_storage.m_data.array[4]);
                  local_800 = sin(local_7f0.E.super_Matrix3d.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                  m_storage.m_data.array[3]);
                  local_808 = cos(local_7f0.E.super_Matrix3d.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                  m_storage.m_data.array[3]);
                  local_918 = local_808 * local_7f8;
                  local_920 = local_800 *
                              local_7f0.E.super_Matrix3d.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[1] +
                              local_808 *
                              local_7f0.E.super_Matrix3d.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[0] *
                              local_7f0.E.super_Matrix3d.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[2];
                  local_928 = local_800 *
                              local_7f0.E.super_Matrix3d.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[2] +
                              -(local_808 *
                                local_7f0.E.super_Matrix3d.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[0] *
                               local_7f0.E.super_Matrix3d.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data.array[1]);
                  local_930 = -local_800 * local_7f8;
                  local_938 = local_808 *
                              local_7f0.E.super_Matrix3d.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[1] +
                              -(local_800 *
                                local_7f0.E.super_Matrix3d.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[0] *
                               local_7f0.E.super_Matrix3d.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data.array[2]);
                  local_950._16_8_ =
                       local_808 *
                       local_7f0.E.super_Matrix3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                       .array[2] +
                       local_800 *
                       local_7f0.E.super_Matrix3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                       .array[0] *
                       local_7f0.E.super_Matrix3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                       .array[1];
                  local_950._8_8_ =
                       -local_7f8 *
                       local_7f0.E.super_Matrix3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                       .array[2];
                  local_950._0_8_ =
                       local_7f8 *
                       local_7f0.E.super_Matrix3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                       .array[1];
                  pSVar13 = (SpatialTransform *)(local_950 + 0x10);
                  pSVar14 = &local_7f0;
                  pMVar15 = (Matrix3d *)(local_950 + 8);
                  pSVar16 = (SpatialTransform *)local_950;
                  Matrix3_t::Matrix3_t
                            (&local_20->E,(double *)pSVar17,(double *)in_stack_fffffffffffff240,
                             in_stack_fffffffffffff238,in_stack_fffffffffffff230,
                             in_stack_fffffffffffff228,in_stack_fffffffffffff260,
                             in_stack_fffffffffffff268,in_stack_fffffffffffff270,
                             in_stack_fffffffffffff278);
                  Vector3_t::Vector3_t
                            (in_stack_fffffffffffff210,(double *)in_stack_fffffffffffff208,
                             (double *)in_stack_fffffffffffff200,(double *)in_stack_fffffffffffff1f8
                            );
                  Math::SpatialTransform::SpatialTransform(pSVar16,pMVar15,(Vector3d *)pSVar14);
                  std::
                  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                  ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                                *)(local_10 + 0x130),(ulong)local_14);
                  Math::SpatialTransform::operator*
                            (in_stack_fffffffffffff288,in_stack_fffffffffffff280);
                  std::
                  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                  ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                                *)(local_10 + 0x2e8),(ulong)local_14);
                  Math::SpatialTransform::operator=(pSVar14,pSVar13);
                  std::
                  vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                *)(local_10 + 0x160),(ulong)local_14);
                  Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::setZero
                            ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)pSVar14);
                  dVar7 = local_808 * local_7f8;
                  std::
                  vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                *)(local_10 + 0x160),(ulong)local_14);
                  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                           operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                      pSVar14,(Index)pSVar13,0x83cb91);
                  *pSVar3 = dVar7;
                  dVar7 = local_800;
                  std::
                  vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                *)(local_10 + 0x160),(ulong)local_14);
                  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                           operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                      pSVar14,(Index)pSVar13,0x83cbde);
                  *pSVar3 = dVar7;
                  dVar7 = -local_800 * local_7f8;
                  std::
                  vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                *)(local_10 + 0x160),(ulong)local_14);
                  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                           operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                      pSVar14,(Index)pSVar13,0x83cc4b);
                  *pSVar3 = dVar7;
                  dVar7 = local_808;
                  std::
                  vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                *)(local_10 + 0x160),(ulong)local_14);
                  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                           operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                      pSVar14,(Index)pSVar13,0x83cc97);
                  *pSVar3 = dVar7;
                  dVar7 = local_7f0.E.super_Matrix3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array[0];
                  std::
                  vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                *)(local_10 + 0x160),(ulong)local_14);
                  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                           operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                      pSVar14,(Index)pSVar13,0x83cce4);
                  *pSVar3 = dVar7;
                  std::
                  vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                *)(local_10 + 0x160),(ulong)local_14);
                  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                           operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                      pSVar14,(Index)pSVar13,0x83cd1e);
                  *pSVar3 = 1.0;
                }
                else {
                  pvVar1 = std::
                           vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                           ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                         *)(local_10 + 0xa0),(ulong)local_14);
                  if (pvVar1->mJointType == JointTypeEulerYXZ) {
                    pSVar17 = local_20;
                    std::
                    vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                  *)(local_10 + 0xa0),(ulong)local_14);
                    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                             operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                                         *)in_stack_fffffffffffff1c0,
                                        (Index)in_stack_fffffffffffff1b8);
                    dVar7 = *pdVar4;
                    std::
                    vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                  *)(local_10 + 0xa0),(ulong)local_14);
                    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                             operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                                         *)in_stack_fffffffffffff1c0,
                                        (Index)in_stack_fffffffffffff1b8);
                    dVar10 = *pdVar4;
                    std::
                    vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                  *)(local_10 + 0xa0),(ulong)local_14);
                    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                             operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                                         *)in_stack_fffffffffffff1c0,
                                        (Index)in_stack_fffffffffffff1b8);
                    dVar12 = *pdVar4;
                    dVar8 = sin(dVar7);
                    dVar7 = cos(dVar7);
                    dVar9 = sin(dVar10);
                    dVar10 = cos(dVar10);
                    dVar11 = sin(dVar12);
                    dVar12 = cos(dVar12);
                    local_b00.E.super_Matrix3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[5] = dVar12 * dVar7 + dVar11 * dVar9 * dVar8;
                    local_b00.E.super_Matrix3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[4] = dVar11 * dVar10;
                    local_b00.E.super_Matrix3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[3] = -dVar12 * dVar8 + dVar11 * dVar9 * dVar7;
                    local_b00.E.super_Matrix3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[2] = -dVar11 * dVar7 + dVar12 * dVar9 * dVar8;
                    local_b00.E.super_Matrix3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[1] = dVar12 * dVar10;
                    local_b00.E.super_Matrix3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[0] = dVar11 * dVar8 + dVar12 * dVar9 * dVar7;
                    local_b18._16_8_ = dVar10 * dVar8;
                    local_b18._8_8_ = -dVar9;
                    local_b18._0_8_ = dVar10 * dVar7;
                    pSVar13 = &local_b00;
                    pSVar14 = (SpatialTransform *)(local_b18 + 0x10);
                    pMVar15 = (Matrix3d *)(local_b18 + 8);
                    pSVar16 = (SpatialTransform *)local_b18;
                    Matrix3_t::Matrix3_t
                              (in_stack_fffffffffffff250,in_stack_fffffffffffff248,
                               (double *)in_stack_fffffffffffff240,in_stack_fffffffffffff238,
                               in_stack_fffffffffffff230,in_stack_fffffffffffff228,
                               in_stack_fffffffffffff260,in_stack_fffffffffffff268,
                               in_stack_fffffffffffff270,in_stack_fffffffffffff278);
                    Vector3_t::Vector3_t
                              ((Vector3_t *)local_20,(double *)pSVar17,
                               (double *)in_stack_fffffffffffff200,
                               (double *)in_stack_fffffffffffff1f8);
                    Math::SpatialTransform::SpatialTransform(pSVar16,pMVar15,(Vector3d *)pSVar14);
                    std::
                    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                    ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                                  *)(local_10 + 0x130),(ulong)local_14);
                    Math::SpatialTransform::operator*
                              (in_stack_fffffffffffff288,in_stack_fffffffffffff280);
                    std::
                    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                    ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                                  *)(local_10 + 0x2e8),(ulong)local_14);
                    Math::SpatialTransform::operator=(pSVar14,pSVar13);
                    std::
                    vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                  *)(local_10 + 0x160),(ulong)local_14);
                    Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::setZero
                              ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)pSVar14);
                    dVar7 = dVar11 * dVar10;
                    std::
                    vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                  *)(local_10 + 0x160),(ulong)local_14);
                    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                             operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                        pSVar14,(Index)pSVar13,0x83d210);
                    *pSVar3 = dVar7;
                    dVar7 = dVar12;
                    std::
                    vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                  *)(local_10 + 0x160),(ulong)local_14);
                    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                             operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                        pSVar14,(Index)pSVar13,0x83d257);
                    *pSVar3 = dVar7;
                    dVar12 = dVar12 * dVar10;
                    std::
                    vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                  *)(local_10 + 0x160),(ulong)local_14);
                    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                             operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                        pSVar14,(Index)pSVar13,0x83d2a7);
                    *pSVar3 = dVar12;
                    SVar5 = -dVar11;
                    std::
                    vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                  *)(local_10 + 0x160),(ulong)local_14);
                    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                             operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                        pSVar14,(Index)pSVar13,0x83d307);
                    *pSVar3 = SVar5;
                    SVar5 = -dVar9;
                    std::
                    vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                  *)(local_10 + 0x160),(ulong)local_14);
                    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                             operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                        pSVar14,(Index)pSVar13,0x83d36b);
                    *pSVar3 = SVar5;
                    std::
                    vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                  *)(local_10 + 0x160),(ulong)local_14);
                    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                             operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                        pSVar14,(Index)pSVar13,0x83d3a5);
                    *pSVar3 = 1.0;
                  }
                  else {
                    pvVar1 = std::
                             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                           *)(local_10 + 0xa0),(ulong)local_14);
                    if (pvVar1->mJointType == JointTypeTranslationXYZ) {
                      std::
                      vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                    *)(local_10 + 0xa0),(ulong)local_14);
                      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                 in_stack_fffffffffffff1c0,(Index)in_stack_fffffffffffff1b8);
                      pSVar13 = local_20;
                      std::
                      vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                    *)(local_10 + 0xa0),(ulong)local_14);
                      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                 in_stack_fffffffffffff1c0,(Index)in_stack_fffffffffffff1b8);
                      std::
                      vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                    *)(local_10 + 0xa0),(ulong)local_14);
                      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                 in_stack_fffffffffffff1c0,(Index)in_stack_fffffffffffff1b8);
                      Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
                      Matrix3_t::
                      Matrix3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
                                (&in_stack_fffffffffffff1c0->E,
                                 (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                                  *)in_stack_fffffffffffff1b8);
                      Vector3_t::Vector3_t
                                (in_stack_fffffffffffff210,(double *)in_stack_fffffffffffff208,
                                 (double *)local_20,(double *)pSVar13);
                      Math::SpatialTransform::SpatialTransform
                                (in_stack_fffffffffffff1d0,(Matrix3d *)in_stack_fffffffffffff1c8,
                                 (Vector3d *)in_stack_fffffffffffff1c0);
                      std::
                      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                      ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                                    *)(local_10 + 0x130),(ulong)local_14);
                      Math::SpatialTransform::operator*
                                (in_stack_fffffffffffff288,in_stack_fffffffffffff280);
                      std::
                      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                      ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                                    *)(local_10 + 0x2e8),(ulong)local_14);
                      Math::SpatialTransform::operator=
                                (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8);
                      std::
                      vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                    *)(local_10 + 0x160),(ulong)local_14);
                      Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::setZero
                                ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                                 in_stack_fffffffffffff1c0);
                      std::
                      vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                    *)(local_10 + 0x160),(ulong)local_14);
                      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                               operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>
                                           *)in_stack_fffffffffffff1c0,
                                          (Index)in_stack_fffffffffffff1b8,0x83d5d2);
                      *pSVar3 = 1.0;
                      std::
                      vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                    *)(local_10 + 0x160),(ulong)local_14);
                      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                               operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>
                                           *)in_stack_fffffffffffff1c0,
                                          (Index)in_stack_fffffffffffff1b8,0x83d60d);
                      *pSVar3 = 1.0;
                      std::
                      vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                    *)(local_10 + 0x160),(ulong)local_14);
                      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                               operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>
                                           *)in_stack_fffffffffffff1c0,
                                          (Index)in_stack_fffffffffffff1b8,0x83d648);
                      *pSVar3 = 1.0;
                    }
                    else {
                      pvVar1 = std::
                               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                             *)(local_10 + 0xa0),(ulong)local_14);
                      if (pvVar1->mJointType != JointTypeCustom) {
                        this = (RBDLError *)__cxa_allocate_exception(0x28);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  (in_stack_fffffffffffff200,(char *)in_stack_fffffffffffff1f8,
                                   in_stack_fffffffffffff1f0);
                        Errors::RBDLError::RBDLError(this,in_stack_fffffffffffff1d8);
                        __cxa_throw(this,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError)
                        ;
                      }
                      pvVar1 = std::
                               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                             *)(local_10 + 0xa0),(ulong)local_14);
                      ppCVar6 = std::
                                vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                                ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                                              *)(local_10 + 0x1d8),(ulong)pvVar1->custom_joint_index
                                            );
                      (**(code **)(*(long *)*ppCVar6 + 0x18))(*ppCVar6,local_10,local_14,local_20);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

RBDL_DLLAPI void jcalc_X_lambda_S (
    Model &model,
    unsigned int joint_id,
    const VectorNd &q
    ) {
  // exception if we calculate it for the root body
  assert (joint_id > 0);

  if (model.mJoints[joint_id].mJointType == JointTypeRevoluteX) {
    model.X_lambda[joint_id] = 
      Xrotx (q[model.mJoints[joint_id].q_index]) * model.X_T[joint_id];
    model.S[joint_id] = model.mJoints[joint_id].mJointAxes[0];
  } else if (model.mJoints[joint_id].mJointType == JointTypeRevoluteY) {
    model.X_lambda[joint_id] = 
      Xroty (q[model.mJoints[joint_id].q_index]) * model.X_T[joint_id];
    model.S[joint_id] = model.mJoints[joint_id].mJointAxes[0];
  } else if (model.mJoints[joint_id].mJointType == JointTypeRevoluteZ) {
    model.X_lambda[joint_id] = 
      Xrotz (q[model.mJoints[joint_id].q_index]) * model.X_T[joint_id];
    model.S[joint_id] = model.mJoints[joint_id].mJointAxes[0];
  } else if (model.mJoints[joint_id].mJointType == JointTypeHelical){
    SpatialTransform XJ = jcalc_XJ (model, joint_id, q);
    model.X_lambda[joint_id] = XJ * model.X_T[joint_id];
    // Set the joint axis
    Vector3d trans = XJ.E * model.mJoints[joint_id].mJointAxes[0].block<3, 1>(3,0);
    
    model.S[joint_id] = SpatialVector(model.mJoints[joint_id].mJointAxes[0][0],
           model.mJoints[joint_id].mJointAxes[0][1],
           model.mJoints[joint_id].mJointAxes[0][2],
           trans[0], trans[1], trans[2]);
  } else if (model.mJoints[joint_id].mDoFCount == 1
      && model.mJoints[joint_id].mJointType != JointTypeCustom){
    model.X_lambda[joint_id] = 
      jcalc_XJ (model, joint_id, q) * model.X_T[joint_id];
    model.S[joint_id] = model.mJoints[joint_id].mJointAxes[0];
  } else if (model.mJoints[joint_id].mJointType == JointTypeSpherical) {
    model.X_lambda[joint_id] = SpatialTransform (
        model.GetQuaternion (joint_id, q).toMatrix(),
        Vector3d (0., 0., 0.))
      * model.X_T[joint_id];

    model.multdof3_S[joint_id].setZero();

    model.multdof3_S[joint_id](0,0) = 1.;
    model.multdof3_S[joint_id](1,1) = 1.;
    model.multdof3_S[joint_id](2,2) = 1.;
  } else if (model.mJoints[joint_id].mJointType == JointTypeEulerZYX) {
    Scalar q0 = q[model.mJoints[joint_id].q_index];
    Scalar q1 = q[model.mJoints[joint_id].q_index + 1];
    Scalar q2 = q[model.mJoints[joint_id].q_index + 2];

    Scalar s0 = sin (q0);
    Scalar c0 = cos (q0);
    Scalar s1 = sin (q1);
    Scalar c1 = cos (q1);
    Scalar s2 = sin (q2);
    Scalar c2 = cos (q2);

    model.X_lambda[joint_id] = SpatialTransform ( 
        Matrix3d(
          c0 * c1, s0 * c1, -s1,
          c0 * s1 * s2 - s0 * c2, s0 * s1 * s2 + c0 * c2, c1 * s2,
          c0 * s1 * c2 + s0 * s2, s0 * s1 * c2 - c0 * s2, c1 * c2
          ),
        Vector3d (0., 0., 0.))
      * model.X_T[joint_id];

    model.multdof3_S[joint_id].setZero();

    model.multdof3_S[joint_id](0,0) = -s1;
    model.multdof3_S[joint_id](0,2) = 1.;

    model.multdof3_S[joint_id](1,0) = c1 * s2;
    model.multdof3_S[joint_id](1,1) = c2;

    model.multdof3_S[joint_id](2,0) = c1 * c2;
    model.multdof3_S[joint_id](2,1) = - s2;
  } else if (model.mJoints[joint_id].mJointType == JointTypeEulerXYZ) {
    Scalar q0 = q[model.mJoints[joint_id].q_index];
    Scalar q1 = q[model.mJoints[joint_id].q_index + 1];
    Scalar q2 = q[model.mJoints[joint_id].q_index + 2];

    Scalar s0 = sin (q0);
    Scalar c0 = cos (q0);
    Scalar s1 = sin (q1);
    Scalar c1 = cos (q1);
    Scalar s2 = sin (q2);
    Scalar c2 = cos (q2);

    model.X_lambda[joint_id] = SpatialTransform (
        Matrix3d(
          c2 * c1, s2 * c0 + c2 * s1 * s0, s2 * s0 - c2 * s1 * c0,
          -s2 * c1, c2 * c0 - s2 * s1 * s0, c2 * s0 + s2 * s1 * c0,
          s1, -c1 * s0, c1 * c0
          ),
        Vector3d (0., 0., 0.))
      * model.X_T[joint_id];

    model.multdof3_S[joint_id].setZero();

    model.multdof3_S[joint_id](0,0) = c2 * c1;
    model.multdof3_S[joint_id](0,1) = s2;

    model.multdof3_S[joint_id](1,0) = -s2 * c1;
    model.multdof3_S[joint_id](1,1) = c2;

    model.multdof3_S[joint_id](2,0) = s1;
    model.multdof3_S[joint_id](2,2) = 1.;
  } else if (model.mJoints[joint_id].mJointType == JointTypeEulerYXZ ) {
    Scalar q0 = q[model.mJoints[joint_id].q_index];
    Scalar q1 = q[model.mJoints[joint_id].q_index + 1];
    Scalar q2 = q[model.mJoints[joint_id].q_index + 2];

    Scalar s0 = sin (q0);
    Scalar c0 = cos (q0);
    Scalar s1 = sin (q1);
    Scalar c1 = cos (q1);
    Scalar s2 = sin (q2);
    Scalar c2 = cos (q2);

    model.X_lambda[joint_id] = SpatialTransform (
        Matrix3d(
          c2 * c0 + s2 * s1 * s0, s2 * c1, -c2 * s0 + s2 * s1 * c0,
          -s2 * c0 + c2 * s1 * s0, c2 * c1, s2 * s0 + c2 * s1 * c0,
          c1 * s0, - s1, c1 * c0
          ),
        Vector3d (0., 0., 0.))
      * model.X_T[joint_id];

    model.multdof3_S[joint_id].setZero();

    model.multdof3_S[joint_id](0,0) = s2 * c1;
    model.multdof3_S[joint_id](0,1) = c2;

    model.multdof3_S[joint_id](1,0) = c2 * c1;
    model.multdof3_S[joint_id](1,1) = -s2;

    model.multdof3_S[joint_id](2,0) = -s1;
    model.multdof3_S[joint_id](2,2) = 1.;
  } else if (model.mJoints[joint_id].mJointType == JointTypeTranslationXYZ) {
    Scalar q0 = q[model.mJoints[joint_id].q_index];
    Scalar q1 = q[model.mJoints[joint_id].q_index + 1];
    Scalar q2 = q[model.mJoints[joint_id].q_index + 2];

    model.X_lambda[joint_id] = SpatialTransform (
        Matrix3d::Identity (),
        Vector3d (q0, q1, q2))
      * model.X_T[joint_id];

    model.multdof3_S[joint_id].setZero();

    model.multdof3_S[joint_id](3,0) = 1.;
    model.multdof3_S[joint_id](4,1) = 1.;
    model.multdof3_S[joint_id](5,2) = 1.;
  } else if (model.mJoints[joint_id].mJointType == JointTypeCustom) {
    const Joint &joint = model.mJoints[joint_id];
    CustomJoint *custom_joint 
      = model.mCustomJoints[joint.custom_joint_index];

    custom_joint->jcalc_X_lambda_S (model, joint_id, q);
  } else {
    throw Errors::RBDLError("Error: invalid joint type!");
  }
}